

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# check.cpp
# Opt level: O2

void pbrt::PrintStackTrace(void)

{
  uint uVar1;
  void *__ptr;
  char *pcVar2;
  char *pcVar3;
  long lVar4;
  ulong uVar5;
  char cVar6;
  char *pcVar7;
  int validCppName;
  char offset [64];
  void *callstack [32];
  char functionSymbol [1024];
  char moduleName [1024];
  
  uVar1 = backtrace(callstack,0x20);
  __ptr = (void *)backtrace_symbols(callstack);
  uVar5 = 0;
  do {
    if (uVar5 == (~((int)uVar1 >> 0x1f) & uVar1)) {
      free(__ptr);
      return;
    }
    memset(moduleName,0,0x400);
    memset(functionSymbol,0,0x400);
    validCppName = 0;
    offset[0] = '\0';
    offset[1] = '\0';
    offset[2] = '\0';
    offset[3] = '\0';
    offset[4] = '\0';
    offset[5] = '\0';
    offset[6] = '\0';
    offset[7] = '\0';
    offset[8] = '\0';
    offset[9] = '\0';
    offset[10] = '\0';
    offset[0xb] = '\0';
    offset[0xc] = '\0';
    offset[0xd] = '\0';
    offset[0xe] = '\0';
    offset[0xf] = '\0';
    offset[0x10] = '\0';
    offset[0x11] = '\0';
    offset[0x12] = '\0';
    offset[0x13] = '\0';
    offset[0x14] = '\0';
    offset[0x15] = '\0';
    offset[0x16] = '\0';
    offset[0x17] = '\0';
    offset[0x18] = '\0';
    offset[0x19] = '\0';
    offset[0x1a] = '\0';
    offset[0x1b] = '\0';
    offset[0x1c] = '\0';
    offset[0x1d] = '\0';
    offset[0x1e] = '\0';
    offset[0x1f] = '\0';
    offset[0x20] = '\0';
    offset[0x21] = '\0';
    offset[0x22] = '\0';
    offset[0x23] = '\0';
    offset[0x24] = '\0';
    offset[0x25] = '\0';
    offset[0x26] = '\0';
    offset[0x27] = '\0';
    offset[0x28] = '\0';
    offset[0x29] = '\0';
    offset[0x2a] = '\0';
    offset[0x2b] = '\0';
    offset[0x2c] = '\0';
    offset[0x2d] = '\0';
    offset[0x2e] = '\0';
    offset[0x2f] = '\0';
    offset[0x30] = '\0';
    offset[0x31] = '\0';
    offset[0x32] = '\0';
    offset[0x33] = '\0';
    offset[0x34] = '\0';
    offset[0x35] = '\0';
    offset[0x36] = '\0';
    offset[0x37] = '\0';
    offset[0x38] = '\0';
    offset[0x39] = '\0';
    offset[0x3a] = '\0';
    offset[0x3b] = '\0';
    offset[0x3c] = '\0';
    offset[0x3d] = '\0';
    offset[0x3e] = '\0';
    offset[0x3f] = '\0';
    pcVar3 = *(char **)((long)__ptr + uVar5 * 8);
    pcVar2 = pcVar3 + 2;
    pcVar7 = moduleName;
    while( true ) {
      cVar6 = *pcVar3;
      if ((cVar6 == '\0') || (cVar6 == '(')) break;
      *pcVar7 = cVar6;
      pcVar7 = pcVar7 + 1;
      pcVar2 = pcVar2 + 1;
      pcVar3 = pcVar3 + 1;
    }
    *pcVar7 = '\0';
    cVar6 = pcVar3[1];
    pcVar7 = functionSymbol;
    if (cVar6 == '+') {
      pcVar2 = pcVar3 + 2;
      builtin_strncpy(functionSymbol,"(unknown)",10);
LAB_002a6b1c:
      for (lVar4 = 0; (cVar6 = pcVar2[lVar4], cVar6 != '\0' && (cVar6 != ')')); lVar4 = lVar4 + 1) {
        offset[lVar4] = cVar6;
      }
      validCppName = 0;
      offset[lVar4] = '\0';
      pcVar3 = (char *)__cxa_demangle(functionSymbol,0,0,&validCppName);
      pcVar2 = functionSymbol;
      if (validCppName == 0) {
        pcVar2 = pcVar3;
      }
      fprintf(_stderr,"(%-40s)\t0x%p - %s + %s\n",moduleName,callstack[uVar5],pcVar2,offset);
    }
    else {
      while ((cVar6 != '\0' && (cVar6 != '+'))) {
        *pcVar7 = cVar6;
        cVar6 = *pcVar2;
        pcVar2 = pcVar2 + 1;
        pcVar7 = pcVar7 + 1;
      }
      *pcVar7 = '\0';
      if (cVar6 == '+') goto LAB_002a6b1c;
      fprintf(_stderr,"Unable to decode frame: %s\n");
    }
    uVar5 = uVar5 + 1;
  } while( true );
}

Assistant:

void PrintStackTrace() {
#if defined(PBRT_IS_OSX)
    void* callstack[32];
    int frames = backtrace(callstack, PBRT_ARRAYSIZE(callstack));
    char** strs = backtrace_symbols(callstack, frames);
    for (int i = 0; i < frames; ++i) {
        // https://www.variadic.xyz/2013/04/14/generating-stack-trace-on-os-x/
        char functionSymbol[1024] = {};
        char moduleName[1024] = {};
        int offset = 0;
        char addr[48] = {};

        // split the string, take out chunks out of stack trace
        // we are primarily interested in module, function and address
        sscanf(strs[i], "%*s %s %s %s %*s %d", moduleName, addr, functionSymbol, &offset);

        if (strcmp(moduleName, "pbrt") != 0)
            // We've past the pbrt stack frames
            break;

        int validCppName = 0;
        char* functionName = abi::__cxa_demangle(functionSymbol, NULL, 0, &validCppName);

        char stackFrame[4096] = {};
        if (validCppName == 0)
            fprintf(stderr, "(%s)\t0x%s - %s + %d\n", moduleName, addr, functionName,
                    offset);
        else
            fprintf(stderr, "(%s)\t0x%s - %s + %d\n", moduleName, addr, functionSymbol,
                    offset);
    }
    free(strs);
#elif defined(PBRT_IS_LINUX)
    void *callstack[32];
    int frames = backtrace(callstack, PBRT_ARRAYSIZE(callstack));
    char **strs = backtrace_symbols(callstack, frames);
    for (int i = 0; i < frames; ++i) {
        char moduleName[1024] = {};
        char functionSymbol[1024] = {};
        char offset[64] = {};
        int validCppName = 0;
        char *demangledFunctionSymbol = nullptr;

        const char *ptr = strs[i];
        char *mptr = moduleName;
        while (*ptr && *ptr != '(')
            *mptr++ = *ptr++;
        *mptr = '\0';
        ++ptr;
        if (*ptr == '+') {
            strcpy(functionSymbol, "(unknown)");
            ++ptr;
        } else {
            // Copy mangled function name
            char *fptr = functionSymbol;
            while (*ptr && *ptr != '+')
                *fptr++ = *ptr++;
            *fptr = '\0';

            if (*ptr != '+') {
                fprintf(stderr, "Unable to decode frame: %s\n", strs[i]);
                continue;
            }
            ++ptr;
        }

        char *optr = offset;
        while (*ptr && *ptr != ')')
            *optr++ = *ptr++;
        *optr = '\0';

        validCppName = 0;
        demangledFunctionSymbol =
            abi::__cxa_demangle(functionSymbol, NULL, 0, &validCppName);

        if (validCppName == 0)
            fprintf(stderr, "(%-40s)\t0x%p - %s + %s\n", moduleName, callstack[i],
                    demangledFunctionSymbol, offset);
        else
            fprintf(stderr, "(%-40s)\t0x%p - %s + %s\n", moduleName, callstack[i],
                    functionSymbol, offset);
    }
    free(strs);
#elif defined(PBRT_IS_WINDOWS)
    // Via
    // https://stackoverflow.com/questions/22467604/how-can-you-use-capturestackbacktrace-to-capture-the-exception-stack-not-the-ca
    void *stack[32];
    constexpr int maxNameLength = 1024;
    HANDLE process = GetCurrentProcess();
    SymInitialize(process, NULL, TRUE);
    WORD nFrames = CaptureStackBackTrace(0, PBRT_ARRAYSIZE(stack), stack, NULL);
    SYMBOL_INFO *symbol =
        (SYMBOL_INFO *)malloc(sizeof(SYMBOL_INFO) + (maxNameLength - 1) * sizeof(TCHAR));
    symbol->MaxNameLen = maxNameLength;
    symbol->SizeOfStruct = sizeof(SYMBOL_INFO);
    DWORD displacement;
    IMAGEHLP_LINE64 *line = (IMAGEHLP_LINE64 *)malloc(sizeof(IMAGEHLP_LINE64));
    line->SizeOfStruct = sizeof(IMAGEHLP_LINE64);
    for (int i = 0; i < nFrames; ++i) {
        DWORD64 address = (DWORD64)(stack[i]);
        SymFromAddr(process, address, NULL, symbol);
        if (SymGetLineFromAddr64(process, address, &displacement, line))
            fprintf(stderr, "(%-40s)\t0x%p - %s + line %d\n", line->FileName,
                    (void *)symbol->Address, symbol->Name, line->LineNumber);
        else
            fprintf(stderr, "(%-40s)\t0x%p - %s\n", "unknown", (void *)symbol->Address,
                    symbol->Name);
    }
#else
#error "TODO: implement PrintStackTrace for target"
#endif
}